

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O0

bool prmon::kernel_proc_pid_test(pid_t pid)

{
  int iVar1;
  ostream *poVar2;
  char *__file;
  int in_EDI;
  stat stat_test;
  stringstream pid_fname;
  string local_250 [32];
  stat local_230;
  stringstream local_190 [16];
  ostream local_180 [376];
  int local_8;
  byte local_1;
  
  local_8 = in_EDI;
  std::__cxx11::stringstream::stringstream(local_190);
  poVar2 = std::operator<<(local_180,"/proc/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8);
  poVar2 = std::operator<<(poVar2,"/task/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8);
  poVar2 = std::operator<<(poVar2,"/children");
  std::ostream::operator<<(poVar2,std::ends<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_230);
  std::__cxx11::string::~string(local_250);
  local_1 = iVar1 == 0;
  std::__cxx11::stringstream::~stringstream(local_190);
  return (bool)(local_1 & 1);
}

Assistant:

bool kernel_proc_pid_test(const pid_t pid) {
  // Return true if the kernel has child PIDs
  // accessible via /proc
  std::stringstream pid_fname{};
  pid_fname << "/proc/" << pid << "/task/" << pid << "/children" << std::ends;
  struct stat stat_test;
  if (stat(pid_fname.str().c_str(), &stat_test)) return false;
  return true;
}